

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

iterator * __thiscall Catch::TextFlow::Column::iterator::operator++(iterator *this)

{
  Column *pCVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = this->m_pos + this->m_len;
  pCVar1 = this->m_column;
  this->m_pos = uVar4;
  uVar2 = (pCVar1->m_string)._M_string_length;
  if ((uVar4 < uVar2) && ((pCVar1->m_string)._M_dataplus._M_p[uVar4] == '\n')) {
    this->m_pos = uVar4 + 1;
  }
  else if (this->m_pos < uVar2) {
    pcVar3 = (pCVar1->m_string)._M_dataplus._M_p;
    uVar4 = this->m_pos;
    do {
      uVar5 = uVar4 + 1;
      uVar4 = (ulong)(byte)pcVar3[uVar4];
      if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
      this->m_pos = uVar5;
      uVar4 = uVar5;
    } while (uVar5 != uVar2);
  }
  if (this->m_pos != uVar2) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::iterator &Column::iterator::operator++() {
            m_pos += m_len;
            std::string const &current_line = m_column.m_string;
            if (m_pos < current_line.size() && current_line[m_pos] == '\n') {
                m_pos += 1;
            }
            else {
                while (m_pos < current_line.size() &&
                    isWhitespace(current_line[m_pos])) {
                    ++m_pos;
                }
            }

            if (m_pos != current_line.size()) {
                calcLength();
            }
            return *this;
        }